

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

WalkResult __thiscall Map::Walk(Map *this,Character *from,Direction direction,bool admin)

{
  list<Character_*,_std::allocator<Character_*>_> *plVar1;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar2;
  string *str;
  short id;
  World *pWVar3;
  pointer ppNVar4;
  Character *pCVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  NPC *pNVar7;
  byte bVar8;
  undefined8 uVar9;
  NPC **ppNVar10;
  pointer psVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  WalkResult WVar15;
  mapped_type *pmVar16;
  Map_Tile *pMVar17;
  Map *pMVar18;
  void *pvVar19;
  _List_node_base *p_Var20;
  Character ***pppCVar21;
  NPC ***pppNVar22;
  void *pvVar23;
  int i;
  Character **ppCVar24;
  pointer psVar25;
  _Alloc_hider _Var26;
  Character **ppCVar27;
  iterator __position;
  NPC **ppNVar28;
  iterator __position_00;
  vector<Character*,std::allocator<Character*>> *this_01;
  vector<NPC*,std::allocator<NPC*>> *this_02;
  byte x;
  ulong uVar29;
  byte y;
  pointer ppNVar30;
  _Alloc_hider _Var31;
  double dVar32;
  PacketBuilder builder;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> oldcoords;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> newcoords;
  vector<NPC_*,_std::allocator<NPC_*>_> oldnpcs;
  vector<NPC_*,_std::allocator<NPC_*>_> newnpcs;
  vector<Character_*,_std::allocator<Character_*>_> oldchars;
  vector<Character_*,_std::allocator<Character_*>_> newchars;
  PacketBuilder rbuilder;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> newitems;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [120];
  _Alloc_hider local_148;
  NPC **ppNStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  NPC **ppNStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Character **local_108;
  Character **ppCStack_100;
  Character **local_f8;
  Character **local_e8;
  Character **ppCStack_e0;
  Character **local_d8;
  double local_d0;
  undefined1 local_c8 [48];
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> local_98;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  pWVar3 = this->world;
  local_1d0._0_8_ = (Character *)local_1c0;
  local_1c0._32_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"SeeDistance","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,(key_type *)local_1d0);
  util::variant::GetInt(pmVar16);
  if ((Character *)local_1d0._0_8_ != (Character *)local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
  }
  uVar9 = local_1c0._32_8_;
  x = from->x;
  y = from->y;
  local_78._0_8_ = ZEXT18(direction);
  switch(local_78._0_8_) {
  case 0:
    y = y + 1;
    break;
  case 1:
    bVar13 = x == 0;
    x = x - 1;
    if (bVar13) {
      return WalkFail;
    }
    break;
  case 2:
    bVar12 = y - 1;
    bVar8 = y;
    goto joined_r0x0017071c;
  case 3:
    x = x + 1;
    bVar12 = y;
    bVar8 = x;
joined_r0x0017071c:
    y = bVar12;
    if (bVar8 == 0) {
      return WalkFail;
    }
  }
  if (*(uchar *)(local_1c0._32_8_ + 0x18) <= x) {
    return WalkFail;
  }
  if (*(uchar *)(local_1c0._32_8_ + 0x19) <= y) {
    return WalkFail;
  }
  local_1c0._84_4_ = ZEXT14(x);
  local_1c0._80_4_ = ZEXT14(y);
  if (!admin) {
    bVar13 = Walkable((Map *)local_1c0._32_8_,x,y,false);
    if (!bVar13) {
      return WalkFail;
    }
    if ((x < *(uchar *)(uVar9 + 0x18)) && (y < *(uchar *)(uVar9 + 0x19))) {
      for (p_Var20 = (((list<Character_*,_std::allocator<Character_*>_> *)(uVar9 + 0x20))->
                     super__List_base<Character_*,_std::allocator<Character_*>_>)._M_impl._M_node.
                     super__List_node_base._M_next; p_Var20 != (_List_node_base *)(uVar9 + 0x20);
          p_Var20 = p_Var20->_M_next) {
        if ((*(byte *)&p_Var20[1]._M_next[0xc]._M_next == x) &&
           (*(byte *)((long)&p_Var20[1]._M_next[0xc]._M_next + 1) == y)) {
          local_d0 = from->last_walk;
          local_1c0._72_8_ = *(World **)uVar9;
          local_1d0._0_8_ = local_1c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"GhostTimer","");
          pmVar16 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)(local_1c0._72_8_ + 0x198),(key_type *)local_1d0);
          local_1c0._72_8_ = util::variant::GetFloat(pmVar16);
          dVar32 = Timer::GetTime();
          local_d0 = local_d0 + (double)local_1c0._72_8_;
          if ((Character *)local_1d0._0_8_ != (Character *)local_1c0) {
            local_1c0._72_8_ = dVar32;
            operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
            dVar32 = (double)local_1c0._72_8_;
          }
          if (dVar32 < local_d0) {
            return WalkFail;
          }
          break;
        }
      }
    }
  }
  pMVar17 = GetTile((Map *)uVar9,(uchar)local_1c0._84_4_,(uchar)local_1c0._80_4_);
  id = (pMVar17->warp).map;
  if (id != 0) {
    if (((pMVar17->warp).levelreq <= from->level) &&
       (((pMVar17->warp).spec == NoDoor || ((pMVar17->warp).open == true)))) {
      pMVar18 = World::GetMap(*(World **)uVar9,id);
      iVar14 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
      if (((char)iVar14 == '\0') &&
         ((pMVar18->evacuate_lock == true && (pMVar18->id != from->map->id)))) {
        pWVar3 = *(World **)local_1c0._32_8_;
        local_1d0._0_8_ = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"map_evacuate_block","")
        ;
        I18N::Format<>(&local_50,&pWVar3->i18n,(string *)local_1d0);
        (*(from->super_Command_Source)._vptr_Command_Source[6])(from,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1d0._0_8_ != local_1c0) {
          operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
        }
        Character::Refresh(from);
      }
      else {
        Character::Warp(from,(pMVar17->warp).map,(pMVar17->warp).x,(pMVar17->warp).y,
                        WARP_ANIMATION_NONE);
      }
      return WalkWarped;
    }
    if (!admin) {
      return WalkFail;
    }
  }
  dVar32 = Timer::GetTime();
  from->last_walk = dVar32;
  from->attacks = 0;
  Character::CancelSpell(from);
  from->direction = direction;
  from->x = x;
  from->y = y;
  local_1c0._104_8_ = 0;
  local_1c0._88_8_ = (pointer)0x0;
  local_1c0._96_8_ = 0;
  local_1c0._56_8_ = (pointer)0x0;
  local_1c0._40_8_ = (void *)0x0;
  local_1c0._48_8_ = (void *)0x0;
  local_d8 = (Character **)0x0;
  local_e8 = (Character **)0x0;
  ppCStack_e0 = (Character **)0x0;
  local_f8 = (Character **)0x0;
  local_108 = (Character **)0x0;
  ppCStack_100 = (Character **)0x0;
  local_118._M_allocated_capacity = 0;
  local_128._M_p = (pointer)0x0;
  ppNStack_120 = (NPC **)0x0;
  local_138._M_allocated_capacity = 0;
  local_148._M_p = (pointer)0x0;
  ppNStack_140 = (NPC **)0x0;
  local_98.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  if (direction < 4) {
    WVar15 = (*(code *)(&DAT_001a6708 + *(int *)(&DAT_001a6708 + local_78._0_8_ * 4)))();
    return WVar15;
  }
  plVar1 = (list<Character_*,_std::allocator<Character_*>_> *)(local_1c0._32_8_ + 0x20);
  p_Var20 = (((list<Character_*,_std::allocator<Character_*>_> *)(local_1c0._32_8_ + 0x20))->
            super__List_base<Character_*,_std::allocator<Character_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var20 != (_List_node_base *)plVar1) {
    do {
      local_1d0._0_8_ = p_Var20[1]._M_next;
      if (((Character *)local_1d0._0_8_ != from) && (local_1c0._48_8_ != local_1c0._40_8_)) {
        uVar29 = 0;
        do {
          if ((*(uint *)(local_1c0._40_8_ + uVar29 * 8) == (uint)*(uchar *)(local_1d0._0_8_ + 0xc0))
             && (*(uint *)(local_1c0._40_8_ + 4 + uVar29 * 8) ==
                 (uint)*(uchar *)(local_1d0._0_8_ + 0xc1))) {
            pppCVar21 = &ppCStack_100;
            __position._M_current = ppCStack_100;
            ppCVar27 = ppCStack_100;
            this_01 = (vector<Character*,std::allocator<Character*>> *)&local_108;
            if (ppCStack_100 == local_f8) {
LAB_00170c5a:
              std::vector<Character*,std::allocator<Character*>>::
              _M_realloc_insert<Character*const&>(this_01,__position,(Character **)local_1d0);
            }
            else {
LAB_00170c1d:
              *ppCVar27 = (Character *)local_1d0._0_8_;
              *pppCVar21 = *pppCVar21 + 1;
            }
          }
          else if ((*(uint *)(local_1c0._88_8_ + uVar29 * 8) ==
                    (uint)*(uchar *)(local_1d0._0_8_ + 0xc0)) &&
                  (*(uint *)(local_1c0._88_8_ + uVar29 * 8 + 4) ==
                   (uint)*(uchar *)(local_1d0._0_8_ + 0xc1))) {
            pppCVar21 = &ppCStack_e0;
            __position._M_current = ppCStack_e0;
            ppCVar27 = ppCStack_e0;
            this_01 = (vector<Character*,std::allocator<Character*>> *)&local_e8;
            if (ppCStack_e0 == local_d8) goto LAB_00170c5a;
            goto LAB_00170c1d;
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < (ulong)((long)(local_1c0._48_8_ - local_1c0._40_8_) >> 3));
      }
      p_Var20 = p_Var20->_M_next;
    } while (p_Var20 != (_List_node_base *)plVar1);
  }
  ppNVar30 = (((vector<NPC_*,_std::allocator<NPC_*>_> *)(local_1c0._32_8_ + 0x38))->
             super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  ppNVar4 = (((vector<NPC_*,_std::allocator<NPC_*>_> *)(local_1c0._32_8_ + 0x38))->
            super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  if (ppNVar30 != ppNVar4) {
    do {
      local_1d0._0_8_ = *ppNVar30;
      if (((char)((Character *)local_1d0._0_8_)->id == '\x01') &&
         (local_1c0._48_8_ != local_1c0._40_8_)) {
        uVar29 = 0;
        do {
          if ((*(uint *)(local_1c0._40_8_ + uVar29 * 8) == (uint)*(byte *)(local_1d0._0_8_ + 2)) &&
             (*(uint *)(local_1c0._40_8_ + 4 + uVar29 * 8) == (uint)*(byte *)(local_1d0._0_8_ + 3)))
          {
            pppNVar22 = &ppNStack_140;
            __position_00._M_current = ppNStack_140;
            ppNVar28 = ppNStack_140;
            this_02 = (vector<NPC*,std::allocator<NPC*>> *)&local_148;
            if (ppNStack_140 == (NPC **)local_138._M_allocated_capacity) {
LAB_00170d53:
              std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                        (this_02,__position_00,(NPC **)local_1d0);
            }
            else {
LAB_00170d14:
              *ppNVar28 = (NPC *)local_1d0._0_8_;
              *pppNVar22 = *pppNVar22 + 1;
            }
          }
          else if ((*(uint *)(local_1c0._88_8_ + uVar29 * 8) == (uint)*(byte *)(local_1d0._0_8_ + 2)
                   ) && (*(uint *)(local_1c0._88_8_ + uVar29 * 8 + 4) ==
                         (uint)*(byte *)(local_1d0._0_8_ + 3))) {
            pppNVar22 = &ppNStack_120;
            __position_00._M_current = ppNStack_120;
            ppNVar28 = ppNStack_120;
            this_02 = (vector<NPC*,std::allocator<NPC*>> *)&local_128;
            if (ppNStack_120 == (NPC **)local_118._M_allocated_capacity) goto LAB_00170d53;
            goto LAB_00170d14;
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < (ulong)((long)(local_1c0._48_8_ - local_1c0._40_8_) >> 3));
      }
      ppNVar30 = ppNVar30 + 1;
    } while (ppNVar30 != ppNVar4);
  }
  plVar2 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
           (local_1c0._32_8_ + 0x68);
  p_Var20 = (((list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             (local_1c0._32_8_ + 0x68))->
            super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var20 != (_List_node_base *)plVar2) {
    do {
      local_1d0._0_8_ = p_Var20[1]._M_next;
      local_1d0._8_8_ = p_Var20[1]._M_prev;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_)->_M_use_count + 1;
        }
      }
      if (local_1c0._48_8_ != local_1c0._40_8_) {
        uVar29 = 0;
        pvVar19 = (void *)local_1c0._40_8_;
        pvVar23 = (void *)local_1c0._48_8_;
        do {
          if ((*(uint *)(local_1c0._88_8_ + uVar29 * 8) == (uint)(byte)*(int *)(local_1d0._0_8_ + 8)
              ) && (*(uint *)(local_1c0._88_8_ + uVar29 * 8 + 4) ==
                    (uint)*(byte *)(local_1d0._0_8_ + 9))) {
            std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
            push_back(&local_98,(value_type *)local_1d0);
            pvVar19 = (void *)local_1c0._40_8_;
            pvVar23 = (void *)local_1c0._48_8_;
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < (ulong)((long)pvVar23 - (long)pvVar19 >> 3));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
      }
      p_Var20 = p_Var20->_M_next;
    } while (p_Var20 != (_List_node_base *)plVar2);
  }
  PacketBuilder::PacketBuilder((PacketBuilder *)local_1d0,PACKET_AVATAR,PACKET_REMOVE,2);
  iVar14 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,iVar14);
  ppCVar27 = ppCStack_100;
  if (local_108 != ppCStack_100) {
    ppCVar24 = local_108;
    do {
      pCVar5 = *ppCVar24;
      PacketBuilder::PacketBuilder((PacketBuilder *)local_c8,PACKET_AVATAR,PACKET_REMOVE,2);
      iVar14 = Character::PlayerID(pCVar5);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,iVar14);
      Character::Send(pCVar5,(PacketBuilder *)local_1d0);
      Character::Send(from,(PacketBuilder *)local_c8);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_c8);
      ppCVar24 = ppCVar24 + 1;
    } while (ppCVar24 != ppCVar27);
  }
  PacketBuilder::Reset((PacketBuilder *)local_1d0,0x3e);
  PacketBuilder::SetID((PacketBuilder *)local_1d0,PACKET_PLAYERS,PACKET_AGREE);
  PacketBuilder::AddByte((PacketBuilder *)local_1d0,0xff);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(local_c8,from);
  PacketBuilder::AddBreakString((PacketBuilder *)local_1d0,(string *)local_c8,0xff);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  iVar14 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,iVar14);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,(int)from->mapid);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,(uint)from->x);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,(uint)from->y);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->direction);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,6);
  Character::PaddedGuildTag_abi_cxx11_((string *)local_c8,from);
  PacketBuilder::AddString((PacketBuilder *)local_1d0,(string *)local_c8);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->level);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->gender);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->hairstyle);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->haircolor);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->race);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,from->maxhp);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,from->hp);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,from->maxtp);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,from->tp);
  Character::AddPaperdollData(from,(PacketBuilder *)local_1d0,"B000A0HSW");
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->sitting);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,from->hidden & 1);
  PacketBuilder::AddByte((PacketBuilder *)local_1d0,0xff);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,1);
  ppCVar27 = ppCStack_e0;
  if (local_e8 != ppCStack_e0) {
    str = (string *)(local_78 + 8);
    ppCVar24 = local_e8;
    do {
      pCVar5 = *ppCVar24;
      PacketBuilder::PacketBuilder((PacketBuilder *)local_c8,PACKET_PLAYERS,PACKET_AGREE,0x3e);
      PacketBuilder::AddByte((PacketBuilder *)local_c8,0xff);
      (*(pCVar5->super_Command_Source)._vptr_Command_Source[2])(str,pCVar5);
      PacketBuilder::AddBreakString((PacketBuilder *)local_c8,str,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._8_8_ != &local_60) {
        operator_delete((void *)local_78._8_8_,(ulong)(local_60._M_allocated_capacity + 1));
      }
      iVar14 = Character::PlayerID(pCVar5);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,iVar14);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,(int)pCVar5->mapid);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,(uint)pCVar5->x);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,(uint)pCVar5->y);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)pCVar5->direction);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,6);
      Character::PaddedGuildTag_abi_cxx11_(str,pCVar5);
      PacketBuilder::AddString((PacketBuilder *)local_c8,str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._8_8_ != &local_60) {
        operator_delete((void *)local_78._8_8_,(ulong)(local_60._M_allocated_capacity + 1));
      }
      PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)pCVar5->level);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)pCVar5->gender);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)pCVar5->hairstyle);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)pCVar5->haircolor);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)pCVar5->race);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,pCVar5->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,pCVar5->hp);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,pCVar5->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)local_c8,pCVar5->tp);
      Character::AddPaperdollData(pCVar5,(PacketBuilder *)local_c8,"B000A0HSW");
      PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)pCVar5->sitting);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,pCVar5->hidden & 1);
      PacketBuilder::AddByte((PacketBuilder *)local_c8,0xff);
      PacketBuilder::AddChar((PacketBuilder *)local_c8,1);
      Character::Send(pCVar5,(PacketBuilder *)local_1d0);
      Character::Send(from,(PacketBuilder *)local_c8);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_c8);
      ppCVar24 = ppCVar24 + 1;
    } while (ppCVar24 != ppCVar27);
  }
  PacketBuilder::Reset((PacketBuilder *)local_1d0,5);
  uVar9 = local_78._0_8_;
  PacketBuilder::SetID((PacketBuilder *)local_1d0,PACKET_WALK,PACKET_PLAYER);
  iVar14 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_1d0,iVar14);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(int)uVar9);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->x);
  PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)from->y);
  p_Var20 = (plVar1->super__List_base<Character_*,_std::allocator<Character_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var20 != (_List_node_base *)plVar1) {
    do {
      pCVar5 = (Character *)p_Var20[1]._M_next;
      if ((pCVar5 != from) && (bVar13 = Character::InRange(from,pCVar5), bVar13)) {
        Character::Send(pCVar5,(PacketBuilder *)local_1d0);
      }
      p_Var20 = p_Var20->_M_next;
    } while (p_Var20 != (_List_node_base *)plVar1);
  }
  PacketBuilder::Reset
            ((PacketBuilder *)local_1d0,
             ((long)local_98.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 + 2);
  PacketBuilder::SetID((PacketBuilder *)local_1d0,PACKET_WALK,PACKET_REPLY);
  PacketBuilder::AddByte((PacketBuilder *)local_1d0,0xff);
  PacketBuilder::AddByte((PacketBuilder *)local_1d0,0xff);
  psVar11 = local_98.
            super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar25 = local_98.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar6 = (psVar25->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar25->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      PacketBuilder::AddShort((PacketBuilder *)local_1d0,(int)peVar6->uid);
      PacketBuilder::AddShort((PacketBuilder *)local_1d0,(int)peVar6->id);
      PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)peVar6->x);
      PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)peVar6->y);
      PacketBuilder::AddThree((PacketBuilder *)local_1d0,peVar6->amount);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar25 = psVar25 + 1;
    } while (psVar25 != psVar11);
  }
  Character::Send(from,(PacketBuilder *)local_1d0);
  PacketBuilder::SetID((PacketBuilder *)local_1d0,PACKET_RANGE,PACKET_REPLY);
  ppNVar10 = ppNStack_120;
  _Var26._M_p = local_148._M_p;
  ppNVar28 = ppNStack_140;
  if ((NPC **)local_128._M_p != ppNStack_120) {
    _Var31._M_p = local_128._M_p;
    do {
      pNVar7 = *(NPC **)_Var31._M_p;
      PacketBuilder::Reset((PacketBuilder *)local_1d0,8);
      PacketBuilder::AddChar((PacketBuilder *)local_1d0,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d0,0xff);
      PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)pNVar7->index);
      PacketBuilder::AddShort((PacketBuilder *)local_1d0,pNVar7->id);
      PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)pNVar7->x);
      PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)pNVar7->y);
      PacketBuilder::AddChar((PacketBuilder *)local_1d0,(uint)pNVar7->direction);
      Character::Send(from,(PacketBuilder *)local_1d0);
      _Var31._M_p = _Var31._M_p + 8;
      _Var26._M_p = local_148._M_p;
      ppNVar28 = ppNStack_140;
    } while ((NPC **)_Var31._M_p != ppNVar10);
  }
  for (; (NPC **)_Var26._M_p != ppNVar28; _Var26._M_p = (pointer)((long)_Var26._M_p + 8)) {
    NPC::RemoveFromView(*(NPC **)_Var26._M_p,from);
  }
  Character::CheckQuestRules(from);
  bVar13 = false;
  if ((from->x < *(uchar *)(local_1c0._32_8_ + 0x18)) &&
     (bVar13 = false, from->y < *(uchar *)(local_1c0._32_8_ + 0x19))) {
    pMVar17 = GetTile((Map *)local_1c0._32_8_,from->x,from->y);
    bVar13 = (uint)(pMVar17->tilespec + ~Spikes1) < 2;
  }
  pWVar3 = *(World **)local_1c0._32_8_;
  local_c8._0_8_ = local_c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"SpikeDamage","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar3->config,(key_type *)local_c8);
  dVar32 = util::variant::GetFloat(pmVar16);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  WVar15 = WalkOK;
  if (((bVar13 && 0.0 < dVar32) && ((from->hidden & 1) == 0)) &&
     (Character::SpikeDamage(from,(int)(dVar32 * (double)from->maxhp)), from->hp == 0)) {
    WVar15 = WalkWarped;
    Character::DeathRespawn(from);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_1d0);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
            (&local_98);
  if ((NPC **)local_148._M_p != (NPC **)0x0) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity - (long)local_148._M_p);
  }
  if ((NPC **)local_128._M_p != (NPC **)0x0) {
    operator_delete(local_128._M_p,local_118._M_allocated_capacity - (long)local_128._M_p);
  }
  if (local_108 != (Character **)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  if (local_e8 != (Character **)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if ((void *)local_1c0._40_8_ != (void *)0x0) {
    operator_delete((void *)local_1c0._40_8_,local_1c0._56_8_ - local_1c0._40_8_);
  }
  if ((pointer)local_1c0._88_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c0._88_8_,local_1c0._104_8_ - local_1c0._88_8_);
  }
  return WVar15;
}

Assistant:

Map::WalkResult Map::Walk(Character *from, Direction direction, bool admin)
{
	int seedistance = this->world->config["SeeDistance"];

	unsigned char target_x = from->x;
	unsigned char target_y = from->y;

	switch (direction)
	{
		case DIRECTION_UP:
			target_y -= 1;

			if (target_y > from->y)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_RIGHT:
			target_x += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_DOWN:
			target_y += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_LEFT:
			target_x -= 1;

			if (target_x > from->x)
			{
				return WalkFail;
			}

			break;
	}

	if (!this->InBounds(target_x, target_y))
		return WalkFail;

	if (!admin)
	{
		if (!this->Walkable(target_x, target_y))
			return WalkFail;

		if (this->Occupied(target_x, target_y, PlayerOnly) && (from->last_walk + double(this->world->config["GhostTimer"]) > Timer::GetTime()))
			return WalkFail;
	}

	const Map_Warp& warp = this->GetWarp(target_x, target_y);

	if (warp)
	{
		if (from->level >= warp.levelreq && (warp.spec == Map_Warp::NoDoor || warp.open))
		{
			Map* map = this->world->GetMap(warp.map);
			if (from->SourceAccess() < ADMIN_GUIDE && map->evacuate_lock && map->id != from->map->id)
			{
				from->StatusMsg(this->world->i18n.Format("map_evacuate_block"));
				from->Refresh();
			}
			else
			{
				from->Warp(warp.map, warp.x, warp.y);
			}

			return WalkWarped;
		}

		if (!admin)
			return WalkFail;
	}

    from->last_walk = Timer::GetTime();
    from->attacks = 0;
    from->CancelSpell();

	from->direction = direction;

	from->x = target_x;
	from->y = target_y;

	int newx;
	int newy;
	int oldx;
	int oldy;

	std::vector<std::pair<int, int>> newcoords;
	std::vector<std::pair<int, int>> oldcoords;

	std::vector<Character *> newchars;
	std::vector<Character *> oldchars;
	std::vector<NPC *> newnpcs;
	std::vector<NPC *> oldnpcs;
	std::vector<std::shared_ptr<Map_Item>> newitems;

	switch (direction)
	{
		case DIRECTION_UP:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y - seedistance + std::abs(i);
				newx = from->x + i;
				oldy = from->y + seedistance + 1 - std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_RIGHT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x + seedistance - std::abs(i);
				newy = from->y + i;
				oldx = from->x - seedistance - 1 + std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_DOWN:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y + seedistance - std::abs(i);
				newx = from->x + i;
				oldy = from->y - seedistance - 1 + std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_LEFT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x - seedistance + std::abs(i);
				newy = from->y + i;
				oldx = from->x + seedistance + 1 - std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

	}

	UTIL_FOREACH(this->characters, checkchar)
	{
		if (checkchar == from)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkchar->x == oldcoords[i].first && checkchar->y == oldcoords[i].second)
			{
				oldchars.push_back(checkchar);
			}
			else if (checkchar->x == newcoords[i].first && checkchar->y == newcoords[i].second)
			{
				newchars.push_back(checkchar);
			}
		}
	}

	UTIL_FOREACH(this->npcs, checknpc)
	{
		if (!checknpc->alive)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checknpc->x == oldcoords[i].first && checknpc->y == oldcoords[i].second)
			{
				oldnpcs.push_back(checknpc);
			}
			else if (checknpc->x == newcoords[i].first && checknpc->y == newcoords[i].second)
			{
				newnpcs.push_back(checknpc);
			}
		}
	}

	UTIL_FOREACH(this->items, checkitem)
	{
		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkitem->x == newcoords[i].first && checkitem->y == newcoords[i].second)
			{
				newitems.push_back(checkitem);
			}
		}
	}

	PacketBuilder builder(PACKET_AVATAR, PACKET_REMOVE, 2);
	builder.AddShort(from->PlayerID());

	UTIL_FOREACH(oldchars, character)
	{
		PacketBuilder rbuilder(PACKET_AVATAR, PACKET_REMOVE, 2);
		rbuilder.AddShort(character->PlayerID());

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(62);
	builder.SetID(PACKET_PLAYERS, PACKET_AGREE);

	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->mapid);
	builder.AddShort(from->x);
	builder.AddShort(from->y);
	builder.AddChar(from->direction);
	builder.AddChar(6); // ?
	builder.AddString(from->PaddedGuildTag());
	builder.AddChar(from->level);
	builder.AddChar(from->gender);
	builder.AddChar(from->hairstyle);
	builder.AddChar(from->haircolor);
	builder.AddChar(from->race);
	builder.AddShort(from->maxhp);
	builder.AddShort(from->hp);
	builder.AddShort(from->maxtp);
	builder.AddShort(from->tp);
	// equipment
	from->AddPaperdollData(builder, "B000A0HSW");
	builder.AddChar(from->sitting);
	builder.AddChar(from->IsHideInvisible());
	builder.AddByte(255);
	builder.AddChar(1); // 0 = NPC, 1 = player

	UTIL_FOREACH(newchars, character)
	{
		PacketBuilder rbuilder(PACKET_PLAYERS, PACKET_AGREE, 62);
		rbuilder.AddByte(255);
		rbuilder.AddBreakString(character->SourceName());
		rbuilder.AddShort(character->PlayerID());
		rbuilder.AddShort(character->mapid);
		rbuilder.AddShort(character->x);
		rbuilder.AddShort(character->y);
		rbuilder.AddChar(character->direction);
		rbuilder.AddChar(6); // ?
		rbuilder.AddString(character->PaddedGuildTag());
		rbuilder.AddChar(character->level);
		rbuilder.AddChar(character->gender);
		rbuilder.AddChar(character->hairstyle);
		rbuilder.AddChar(character->haircolor);
		rbuilder.AddChar(character->race);
		rbuilder.AddShort(character->maxhp);
		rbuilder.AddShort(character->hp);
		rbuilder.AddShort(character->maxtp);
		rbuilder.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(rbuilder, "B000A0HSW");

		rbuilder.AddChar(character->sitting);
		rbuilder.AddChar(character->IsHideInvisible());
		rbuilder.AddByte(255);
		rbuilder.AddChar(1); // 0 = NPC, 1 = player

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(5);
	builder.SetID(PACKET_WALK, PACKET_PLAYER);

	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);
	builder.AddChar(from->x);
	builder.AddChar(from->y);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	builder.Reset(2 + newitems.size() * 9);
	builder.SetID(PACKET_WALK, PACKET_REPLY);

	builder.AddByte(255);
	builder.AddByte(255);
	UTIL_FOREACH(newitems, item)
	{
		builder.AddShort(item->uid);
		builder.AddShort(item->id);
		builder.AddChar(item->x);
		builder.AddChar(item->y);
		builder.AddThree(item->amount);
	}
	from->Send(builder);

	builder.SetID(PACKET_RANGE, PACKET_REPLY);
	UTIL_FOREACH(newnpcs, npc)
	{
		builder.Reset(8);
		builder.AddChar(0);
		builder.AddByte(255);
		builder.AddChar(npc->index);
		builder.AddShort(npc->id);
		builder.AddChar(npc->x);
		builder.AddChar(npc->y);
		builder.AddChar(npc->direction);

		from->Send(builder);
	}

	UTIL_FOREACH(oldnpcs, npc)
	{
		npc->RemoveFromView(from);
	}

	from->CheckQuestRules();

	Map_Tile::TileSpec spec = this->GetSpec(from->x, from->y);

	double spike_damage = this->world->config["SpikeDamage"];

	if (spike_damage > 0.0 && (spec == Map_Tile::Spikes2 || spec == Map_Tile::Spikes3) && !from->IsHideInvisible())
	{
		int amount = from->maxhp * spike_damage;

		from->SpikeDamage(amount);

		if (from->hp == 0)
		{
			from->DeathRespawn();
			return WalkWarped;
		}	
	}

	return WalkOK;
}